

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O3

MusInfo * I_RegisterURLSong(char *url)

{
  int iVar1;
  StreamSong *this;
  
  this = (StreamSong *)operator_new(0x18);
  StreamSong::StreamSong(this,url);
  iVar1 = (*(this->super_MusInfo)._vptr_MusInfo[10])(this);
  if ((char)iVar1 == '\0') {
    (*(this->super_MusInfo)._vptr_MusInfo[1])(this);
    this = (StreamSong *)0x0;
  }
  return &this->super_MusInfo;
}

Assistant:

MusInfo *I_RegisterURLSong (const char *url)
{
	StreamSong *song;

	song = new StreamSong(url);
	if (song->IsValid())
	{
		return song;
	}
	delete song;
	return NULL;
}